

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_shutdown(int s,int how)

{
  int iVar1;
  int *piVar2;
  int unaff_retaddr;
  nn_sock *in_stack_00000008;
  nn_sock *sock;
  int rc;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  iVar1 = nn_global_hold_socket
                    ((nn_sock **)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
  if (iVar1 < 0) {
    iVar1 = -iVar1;
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    local_4 = -1;
  }
  else {
    iVar1 = nn_sock_rm_ep(in_stack_00000008,unaff_retaddr);
    if (iVar1 < 0) {
      nn_global_rele_socket((nn_sock *)0x133d56);
      iVar1 = -iVar1;
      piVar2 = __errno_location();
      *piVar2 = iVar1;
      local_4 = -1;
    }
    else {
      if (iVar1 != 0) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/global.c"
                ,0x29a);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_global_rele_socket((nn_sock *)0x133ddf);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int nn_shutdown (int s, int how)
{
    int rc;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    rc = nn_sock_rm_ep (sock, how);
    if (nn_slow (rc < 0)) {
        nn_global_rele_socket (sock);
        errno = -rc;
        return -1;
    }
    nn_assert (rc == 0);

    nn_global_rele_socket (sock);
    return 0;
}